

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directives.cpp
# Opt level: O3

bool DirectiveStartFunction(ArgumentList *List,int flags)

{
  CDirectiveFunction *this;
  
  this = (CDirectiveFunction *)operator_new(0x18);
  CDirectiveFunction::CDirectiveFunction
            (this,&((List->entries).
                    super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_start)->text,Global.Section);
  AddAssemblerCommand((CAssemblerCommand *)0x13ccec);
  return true;
}

Assistant:

bool DirectiveStartFunction(ArgumentList& List, int flags)
{
	CDirectiveFunction* func = new CDirectiveFunction(List[0].text,Global.Section);
	AddAssemblerCommand(func);
	return true;
}